

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-uri.cpp
# Opt level: O3

void __thiscall nlohmann::json_uri::update(json_uri *this,string *uri)

{
  string *this_00;
  json_uri *pjVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long *plVar5;
  invalid_argument *this_01;
  size_type *psVar6;
  pointer pbVar7;
  string hex;
  string pointer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> location;
  string_t local_118;
  undefined1 local_f8 [24];
  long lStack_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  json_uri *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d8._M_allocated_capacity = (size_type)&local_c8;
  local_98 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
  lVar2 = std::__cxx11::string::find((char)uri,0x23);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&local_118,(ulong)uri);
    std::__cxx11::string::operator=((string *)local_d8._M_local_buf,(string *)&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    uVar3 = std::__cxx11::string::rfind((char)&local_d8,0x25);
    if (uVar3 != 0xffffffffffffffff) {
      do {
        if (uVar3 < local_d8._8_8_ - 2) {
          std::__cxx11::string::substr((ulong)&local_118,(ulong)&local_d8);
          strtoul(local_118._M_dataplus._M_p,(char **)0x0,0x10);
          std::__cxx11::string::replace((ulong)&local_d8,uVar3,3,'\x01');
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
        }
        uVar3 = std::__cxx11::string::rfind((char)&local_d8,0x25);
      } while (uVar3 != 0xffffffffffffffff);
    }
  }
  std::__cxx11::string::substr((ulong)&local_b8,(ulong)uri);
  pjVar1 = local_98;
  if (local_b0 != 0) {
    lVar2 = std::__cxx11::string::find((char *)&local_b8,0x144364,0);
    if (lVar2 == 0) {
      std::__cxx11::string::_M_assign((string *)pjVar1);
      std::__cxx11::string::_M_replace
                ((ulong)&pjVar1->scheme_,0,(char *)(pjVar1->scheme_)._M_string_length,0x141b00);
      std::__cxx11::string::_M_replace
                ((ulong)&pjVar1->authority_,0,(char *)(pjVar1->authority_)._M_string_length,0x141b00
                );
      std::__cxx11::string::_M_replace
                ((ulong)&pjVar1->path_,0,(char *)(pjVar1->path_)._M_string_length,0x141b00);
    }
    else {
      lVar2 = std::__cxx11::string::find((char *)&local_b8,0x140573,0);
      uVar3 = 0;
      if (lVar2 != -1) {
        std::__cxx11::string::_M_replace
                  ((ulong)pjVar1,0,(char *)(pjVar1->urn_)._M_string_length,0x141b00);
        std::__cxx11::string::substr((ulong)&local_118,(ulong)&local_b8);
        std::__cxx11::string::operator=((string *)&pjVar1->scheme_,(string *)&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        uVar3 = lVar2 + 3;
        uVar4 = std::__cxx11::string::find((char *)&local_b8,0x140575,uVar3);
        if (uVar4 != 0xffffffffffffffff) {
          std::__cxx11::string::substr((ulong)&local_118,(ulong)&local_b8);
          std::__cxx11::string::operator=((string *)&pjVar1->authority_,(string *)&local_118);
          uVar3 = uVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
        }
      }
      std::__cxx11::string::substr((ulong)&local_118,(ulong)&local_b8);
      if (local_118._M_string_length != 0 && (pjVar1->urn_)._M_string_length != 0) {
        this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::operator+(&local_50,"Cannot add a path (",&local_118);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_90._M_dataplus._M_p = (pointer)*plVar5;
        psVar6 = (size_type *)(plVar5 + 2);
        if ((size_type *)local_90._M_dataplus._M_p == psVar6) {
          local_90.field_2._M_allocated_capacity = *psVar6;
          local_90.field_2._8_8_ = plVar5[3];
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        }
        else {
          local_90.field_2._M_allocated_capacity = *psVar6;
        }
        local_90._M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::operator+(&local_70,&local_90,&local_98->urn_);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
        local_f8._0_8_ = *plVar5;
        pbVar7 = (pointer)(plVar5 + 2);
        if ((pointer)local_f8._0_8_ == pbVar7) {
          local_f8._16_8_ = (pbVar7->_M_dataplus)._M_p;
          lStack_e0 = plVar5[3];
          local_f8._0_8_ = (pointer)(local_f8 + 0x10);
        }
        else {
          local_f8._16_8_ = (pbVar7->_M_dataplus)._M_p;
        }
        local_f8._8_8_ = plVar5[1];
        *plVar5 = (long)pbVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::invalid_argument::invalid_argument(this_01,(string *)local_f8);
        __cxa_throw(this_01,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      if (*local_118._M_dataplus._M_p == '/') {
        std::__cxx11::string::_M_assign((string *)&pjVar1->path_);
      }
      else {
        this_00 = &pjVar1->path_;
        if (uVar3 == 0) {
          std::__cxx11::string::rfind((char)this_00,0x2f);
          std::__cxx11::string::substr((ulong)&local_90,(ulong)this_00);
          plVar5 = (long *)std::__cxx11::string::_M_replace_aux
                                     ((ulong)&local_90,local_90._M_string_length,0,'\x01');
          psVar6 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar6) {
            local_70.field_2._M_allocated_capacity = *psVar6;
            local_70.field_2._8_8_ = plVar5[3];
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          }
          else {
            local_70.field_2._M_allocated_capacity = *psVar6;
            local_70._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_70._M_string_length = plVar5[1];
          *plVar5 = (long)psVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_70,(ulong)local_118._M_dataplus._M_p);
          pbVar7 = (pointer)(plVar5 + 2);
          if ((pointer)*plVar5 == pbVar7) {
            local_f8._16_8_ = (pbVar7->_M_dataplus)._M_p;
            lStack_e0 = plVar5[3];
            local_f8._0_8_ = (pointer)(local_f8 + 0x10);
          }
          else {
            local_f8._16_8_ = (pbVar7->_M_dataplus)._M_p;
            local_f8._0_8_ = (pointer)*plVar5;
          }
          local_f8._8_8_ = plVar5[1];
          *plVar5 = (long)pbVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::operator=((string *)this_00,(string *)local_f8);
          if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
            operator_delete((void *)local_f8._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_f8._16_8_)->_M_p + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          std::__cxx11::string::_M_append((char *)this_00,(ulong)local_118._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
    }
  }
  local_118._M_string_length = 0;
  local_118.field_2._M_allocated_capacity =
       local_118.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  json_abi_v3_11_2::
  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_f8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  local_118.field_2._M_allocated_capacity =
       (size_type)
       (pjVar1->pointer_).reference_tokens.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pjVar1->pointer_).reference_tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_f8._16_8_;
  local_118._M_dataplus._M_p =
       (pointer)(pjVar1->pointer_).reference_tokens.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_118._M_string_length =
       (size_type)
       (pjVar1->pointer_).reference_tokens.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (pjVar1->pointer_).reference_tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_f8._0_8_;
  (pjVar1->pointer_).reference_tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_f8._8_8_;
  local_f8._0_8_ = (pointer)0x0;
  local_f8._8_8_ = (pointer)0x0;
  local_f8._16_8_ = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_f8);
  std::__cxx11::string::_M_replace
            ((ulong)&pjVar1->identifier_,0,(char *)(pjVar1->identifier_)._M_string_length,0x141b00);
  if (*(char *)local_d8._M_allocated_capacity == '/') {
    json_abi_v3_11_2::
    json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_f8,(string_t *)&local_d8);
    local_118.field_2._M_allocated_capacity =
         (size_type)
         (pjVar1->pointer_).reference_tokens.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pjVar1->pointer_).reference_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_f8._16_8_;
    local_118._M_dataplus._M_p =
         (pointer)(pjVar1->pointer_).reference_tokens.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_118._M_string_length =
         (size_type)
         (pjVar1->pointer_).reference_tokens.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pjVar1->pointer_).reference_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_f8._0_8_;
    (pjVar1->pointer_).reference_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_f8._8_8_;
    local_f8._0_8_ = (pointer)0x0;
    local_f8._8_8_ = (pointer)0x0;
    local_f8._16_8_ = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_118);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_f8);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&pjVar1->identifier_);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_allocated_capacity != &local_c8) {
    operator_delete((void *)local_d8._M_allocated_capacity,local_c8._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void json_uri::update(const std::string &uri)
{
	std::string pointer = ""; // default pointer is document-root

	// first split the URI into location and pointer
	auto pointer_separator = uri.find('#');
	if (pointer_separator != std::string::npos) {    // and extract the pointer-string if found
		pointer = uri.substr(pointer_separator + 1); // remove #

		// unescape %-values IOW, decode JSON-URI-formatted JSON-pointer
		std::size_t pos = pointer.size() - 1;
		do {
			pos = pointer.rfind('%', pos);
			if (pos == std::string::npos)
				break;

			if (pos >= pointer.size() - 2) {
				pos--;
				continue;
			}

			std::string hex = pointer.substr(pos + 1, 2);
			char ascii = static_cast<char>(std::strtoul(hex.c_str(), nullptr, 16));
			pointer.replace(pos, 3, 1, ascii);

			pos--;
		} while (1);
	}

	auto location = uri.substr(0, pointer_separator);

	if (location.size()) { // a location part has been found

		// if it is an URN take it as it is
		if (location.find("urn:") == 0) {
			urn_ = location;

			// and clear URL members
			scheme_ = "";
			authority_ = "";
			path_ = "";

		} else { // it is an URL

			// split URL in protocol, hostname and path
			std::size_t pos = 0;
			auto proto = location.find("://", pos);
			if (proto != std::string::npos) { // extract the protocol

				urn_ = ""; // clear URN-member if URL is parsed

				scheme_ = location.substr(pos, proto - pos);
				pos = 3 + proto; // 3 == "://"

				auto authority = location.find("/", pos);
				if (authority != std::string::npos) { // and the hostname (no proto without hostname)
					authority_ = location.substr(pos, authority - pos);
					pos = authority;
				}
			}

			auto path = location.substr(pos);

			// URNs cannot of have paths
			if (urn_.size() && path.size())
				throw std::invalid_argument("Cannot add a path (" + path + ") to an URN URI (" + urn_ + ")");

			if (path[0] == '/') // if it starts with a / it is root-path
				path_ = path;
			else if (pos == 0) { // the URL contained only a path and the current path has no / at the end, strip last element until / and append
				auto last_slash = path_.rfind('/');
				path_ = path_.substr(0, last_slash) + '/' + path;
			} else // otherwise it is a subfolder
				path_.append(path);
		}
	}

	pointer_ = ""_json_pointer;
	identifier_ = "";

	if (pointer[0] == '/')
		pointer_ = json::json_pointer(pointer);
	else
		identifier_ = pointer;
}